

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  connectdata *pcVar1;
  CURLMcode CVar2;
  CURLMcode CVar3;
  Curl_sh_entry *hash;
  Curl_hash_element *pCVar4;
  Curl_tree *pCVar5;
  undefined7 in_register_00000031;
  Curl_easy *pCVar6;
  curltime cVar7;
  curltime now;
  curltime local_f0;
  Curl_tree *t;
  int *local_d8;
  Curl_hash_iterator iter;
  
  cVar7 = Curl_now();
  local_f0.tv_sec = cVar7.tv_sec;
  local_f0.tv_usec = cVar7.tv_usec;
  if ((int)CONCAT71(in_register_00000031,checkall) == 0) {
    local_d8 = running_handles;
    if (s == -1) {
      (multi->timer_lastcall).tv_sec = 0;
      *(undefined8 *)&(multi->timer_lastcall).tv_usec = 0;
    }
    else {
      hash = sh_getentry(&multi->sockhash,s);
      if (hash != (Curl_sh_entry *)0x0) {
        Curl_hash_start_iterate(&hash->transfers,&iter);
        while (pCVar4 = Curl_hash_next_element(&iter), pCVar4 != (Curl_hash_element *)0x0) {
          pCVar6 = (Curl_easy *)pCVar4->ptr;
          pcVar1 = pCVar6->conn;
          if ((pcVar1 != (connectdata *)0x0) && ((pcVar1->handler->flags & 8) == 0)) {
            pcVar1->cselect_bits = ev_bitmask;
          }
          Curl_expire(pCVar6,0,EXPIRE_RUN_NOW);
        }
        cVar7 = Curl_now();
        local_f0.tv_sec = cVar7.tv_sec;
        local_f0.tv_usec = cVar7.tv_usec;
      }
    }
    pCVar6 = (Curl_easy *)0x0;
    CVar2 = CURLM_OK;
    do {
      if (pCVar6 != (Curl_easy *)0x0) {
        sigpipe_ignore(pCVar6,(sigpipe_ignore *)&iter);
        CVar2 = multi_runsingle(multi,&local_f0,pCVar6);
        sigpipe_restore((sigpipe_ignore *)&iter);
        if (CVar2 < CURLM_BAD_HANDLE) {
          CVar3 = singlesocket(multi,pCVar6);
          CVar2 = CURLM_OK;
          if (CVar3 != CURLM_OK) {
            return CVar3;
          }
        }
      }
      cVar7.tv_usec = local_f0.tv_usec;
      cVar7.tv_sec = local_f0.tv_sec;
      cVar7._12_4_ = 0;
      pCVar5 = Curl_splaygetbest(cVar7,multi->timetree,&t);
      multi->timetree = pCVar5;
      if (t == (Curl_tree *)0x0) break;
      pCVar6 = (Curl_easy *)t->payload;
      now.tv_usec = local_f0.tv_usec;
      now.tv_sec = local_f0.tv_sec;
      now._12_4_ = 0;
      add_next_timeout(now,multi,pCVar6);
    } while (t != (Curl_tree *)0x0);
    *local_d8 = multi->num_alive;
  }
  else {
    CVar2 = curl_multi_perform(multi,running_handles);
    pCVar6 = (Curl_easy *)multi;
    if (CVar2 == CURLM_BAD_HANDLE) {
      CVar2 = CURLM_BAD_HANDLE;
    }
    else {
      while ((CVar2 == CURLM_OK && (pCVar6 = pCVar6->next, pCVar6 != (Curl_easy *)0x0))) {
        CVar2 = singlesocket(multi,pCVar6);
      }
    }
  }
  return CVar2;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data = multi->easyp;
      while(data && !result) {
        result = singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  if(s != CURL_SOCKET_TIMEOUT) {
    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      struct Curl_hash_iterator iter;
      struct Curl_hash_element *he;

      /* the socket can be shared by many transfers, iterate */
      Curl_hash_start_iterate(&entry->transfers, &iter);
      for(he = Curl_hash_next_element(&iter); he;
          he = Curl_hash_next_element(&iter)) {
        data = (struct Curl_easy *)he->ptr;
        DEBUGASSERT(data);
        DEBUGASSERT(data->magic == CURLEASY_MAGIC_NUMBER);

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* set socket event bitmask if they're not locked */
          data->conn->cselect_bits = ev_bitmask;

        Curl_expire(data, 0, EXPIRE_RUN_NOW);
      }

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_now(); /* get a newer time since the multi_runsingle() loop
                           may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       Curl_update_timer() to trigger a callback to the app again even if the
       same timeout is still the one to run after this call. That handles the
       case when the application asks libcurl to run the timeout
       prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      SIGPIPE_VARIABLE(pipe_st);

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, &now, data);
      sigpipe_restore(&pipe_st);

      if(CURLM_OK >= result) {
        /* get the socket(s) and check if the state has been changed since
           last */
        result = singlesocket(multi, data);
        if(result)
          return result;
      }
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);

  *running_handles = multi->num_alive;
  return result;
}